

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

void copy64(uint8_t *dst,uint64_t src)

{
  uint64_t src_local;
  uint8_t *dst_local;
  
  *dst = (uint8_t)(src >> 0x38);
  dst[1] = (uint8_t)(src >> 0x30);
  dst[2] = (uint8_t)(src >> 0x28);
  dst[3] = (uint8_t)(src >> 0x20);
  dst[4] = (uint8_t)(src >> 0x18);
  dst[5] = (uint8_t)(src >> 0x10);
  dst[6] = (uint8_t)(src >> 8);
  dst[7] = (uint8_t)src;
  return;
}

Assistant:

static inline void copy64(uint8_t *dst, uint64_t src)
{
    dst[0] = (uint8_t)(src >> 56);
    dst[1] = (uint8_t)(src >> 48);
    dst[2] = (uint8_t)(src >> 40);
    dst[3] = (uint8_t)(src >> 32);
    dst[4] = (uint8_t)(src >> 24);
    dst[5] = (uint8_t)(src >> 16);
    dst[6] = (uint8_t)(src >> 8);
    dst[7] = (uint8_t)src;
}